

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

ssize_t __thiscall Fl_Preferences::Node::write(Node *this,int __fd,void *__buf,size_t __n)

{
  char *__ptr;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  undefined4 in_register_00000034;
  FILE *__stream;
  size_t written;
  size_t cnt;
  char *src;
  int i;
  FILE *f_local;
  Node *this_local;
  
  __stream = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->next_ != (Node *)0x0) {
    write(this->next_,__fd,__buf,__n);
  }
  fprintf(__stream,"\n[%s]\n\n",this->path_);
  __buf_00 = extraout_RDX;
  for (src._4_4_ = 0; src._4_4_ < this->nEntry_; src._4_4_ = src._4_4_ + 1) {
    __ptr = this->entry_[src._4_4_].value;
    if (__ptr == (char *)0x0) {
      fprintf(__stream,"%s\n",this->entry_[src._4_4_].name);
      __buf_00 = extraout_RDX_02;
    }
    else {
      fprintf(__stream,"%s:",this->entry_[src._4_4_].name);
      for (written = 0; (written < 0x3c && (__ptr[written] != '\0')); written = written + 1) {
      }
      fwrite(__ptr,written,1,__stream);
      fprintf(__stream,"\n");
      __buf_00 = extraout_RDX_00;
      for (cnt = (size_t)(__ptr + written); *(char *)cnt != '\0'; cnt = written + cnt) {
        for (written = 0; (written < 0x50 && (*(char *)(cnt + written) != '\0'));
            written = written + 1) {
        }
        fputc(0x2b,__stream);
        fwrite((void *)cnt,written,1,__stream);
        fputc(10,__stream);
        __buf_00 = extraout_RDX_01;
      }
    }
  }
  if (this->child_ != (Node *)0x0) {
    write(this->child_,__fd,__buf_00,(size_t)this);
  }
  this->field_0x30 = this->field_0x30 & 0xfe;
  return 0;
}

Assistant:

int Fl_Preferences::Node::write( FILE *f ) {
  if ( next_ ) next_->write( f );
  fprintf( f, "\n[%s]\n\n", path_ );
  for ( int i = 0; i < nEntry_; i++ ) {
    char *src = entry_[i].value;
    if ( src ) {		// hack it into smaller pieces if needed
      fprintf( f, "%s:", entry_[i].name );
      size_t cnt, written = 0;
      for ( cnt = 0; cnt < 60; cnt++ )
	if ( src[cnt]==0 ) break;
      written += fwrite( src, cnt, 1, f );
      fprintf( f, "\n" );
      src += cnt;
      for (;*src;) {
	for ( cnt = 0; cnt < 80; cnt++ )
	  if ( src[cnt]==0 ) break;
        fputc( '+', f );
	written += fwrite( src, cnt, 1, f );
        fputc( '\n', f );
	src += cnt;
      }
    }
    else
      fprintf( f, "%s\n", entry_[i].name );
  }
  if ( child_ ) child_->write( f );
  dirty_ = 0;
  return 0;
}